

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test2::test
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  GLuint program_id;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 uVar6;
  char *pcVar7;
  undefined4 uVar8;
  programInfo program_info;
  programInfo local_1d8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar4;
  
  uVar6 = 0;
  if (shader_stage - FRAGMENT_SHADER < 5) {
    uVar6 = *(undefined4 *)(&DAT_01a45564 + (ulong)(shader_stage - FRAGMENT_SHADER) * 4);
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar8 = 0x400;
  if (shader_stage == FRAGMENT_SHADER) {
    uVar8 = 4;
  }
  local_1d8.m_context = (this->super_TestCase).m_context;
  local_1d8.m_compute_shader_id = 0;
  local_1d8.m_fragment_shader_id = 0;
  local_1d8.m_geometry_shader_id = 0;
  local_1d8.m_program_object_id = 0;
  local_1d8.m_tesselation_control_shader_id = 0;
  local_1d8.m_tesselation_evaluation_shader_id = 0;
  local_1d8.m_vertex_shader_id = 0;
  prepareProgram(this,shader_stage,uniform_type,&local_1d8);
  program_id = local_1d8.m_program_object_id;
  (**(code **)(lVar4 + 0x1680))(local_1d8.m_program_object_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x10bf);
  prepareUniforms(this,shader_stage,uniform_type,&local_1d8);
  testBegin(this,program_id,shader_stage);
  if (shader_stage == COMPUTE_SHADER) {
    (*this->m_pDispatchCompute)(0x20,0x20,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    iVar2 = 0x10cb;
    pcVar7 = "DispatchCompute";
  }
  else {
    (**(code **)(lVar4 + 0x538))(uVar6,0,uVar8);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    iVar2 = 0x10d0;
    pcVar7 = "DrawArrays";
  }
  glu::checkError(dVar3,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,iVar2);
  testEnd(this,shader_stage);
  bVar1 = verifyResults(this,shader_stage);
  if (!bVar1) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Shader stage: ",0xe);
    if (shader_stage < (TESS_EVAL_SHADER|GEOMETRY_SHADER)) {
      pcVar7 = *(char **)(&DAT_020de7d8 + (ulong)shader_stage * 8);
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar7,sVar5);
    }
    else {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,". Uniform type: ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(uniform_type->m_type_name)._M_dataplus._M_p,
               (uniform_type->m_type_name)._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  Utils::programInfo::~programInfo(&local_1d8);
  return bVar1;
}

Assistant:

bool GPUShaderFP64Test2::test(shaderStage shader_stage, const uniformTypeDetails& uniform_type) const
{
	const glw::GLenum		draw_primitive = getDrawPrimitiveType(shader_stage);
	static const glw::GLint first_vertex   = 0;
	const glw::Functions&   gl			   = m_context.getRenderContext().getFunctions();
	const glw::GLsizei		n_vertices	 = (FRAGMENT_SHADER == shader_stage) ? 4 : m_n_captured_results;
	Utils::programInfo		program_info(m_context);
	bool					result = true;

	/* Prepare program */
	prepareProgram(shader_stage, uniform_type, program_info);

	gl.useProgram(program_info.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare uniform buffer and bind it with uniform block */
	prepareUniforms(shader_stage, uniform_type, program_info);

	/* Prepare storage for test results */
	testBegin(program_info.m_program_object_id, shader_stage);

	/* Execute */
	if (COMPUTE_SHADER == shader_stage)
	{
		m_pDispatchCompute(m_texture_width, m_texture_height, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
	}
	else
	{
		gl.drawArrays(draw_primitive, first_vertex, n_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");
	}

	/* Clean after test */
	testEnd(shader_stage);

	/* Check results */
	if (false == verifyResults(shader_stage))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Shader stage: " << getShaderStageName(shader_stage)
			<< ". Uniform type: " << uniform_type.m_type_name << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}